

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O2

void __thiscall
trng::lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U>::step
          (lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->S).index;
  uVar2 = uVar1 + 1 & 0x7fff;
  (this->S).index = uVar2;
  (this->S).r[uVar2] =
       (this->S).r[uVar1 + 0x6456 & 0x7fff] ^ (this->S).r[uVar1 + 0x70ed & 0x7fff] ^
       (this->S).r[uVar1 + 0x52c5 & 0x7fff] ^ (this->S).r[uVar1 + 0x3220 & 0x7fff];
  return;
}

Assistant:

void step() {
      constexpr auto mask_D{int_math::mask(static_cast<decltype(S.index)>(D))};
      ++S.index;
      S.index &= mask_D;
      S.r[S.index] = S.r[(S.index - A) & mask_D] ^ S.r[(S.index - B) & mask_D] ^
                     S.r[(S.index - C) & mask_D] ^ S.r[(S.index - D) & mask_D];
    }